

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall SharedPtrTests_misc_Reset_Test::TestBody(SharedPtrTests_misc_Reset_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_100;
  Message local_f8;
  int local_ec;
  size_t local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_3;
  Message local_c8;
  int local_bc;
  size_t local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  Message local_98;
  int *local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70;
  int *local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  undefined1 local_40 [8];
  SharedPtr<int> t2;
  SharedPtr<int> t1;
  int *b;
  int *a;
  SharedPtrTests_misc_Reset_Test *this_local;
  
  a = (int *)this;
  b = (int *)operator_new(4);
  t1.pointersAmount = (atomic<unsigned_long> *)operator_new(4);
  *b = 0x4d2;
  *(undefined4 *)&((t1.pointersAmount)->super___atomic_base<unsigned_long>)._M_i = 0x162e;
  SharedPtr<int>::SharedPtr((SharedPtr<int> *)&t2.pointersAmount,b);
  SharedPtr<int>::SharedPtr((SharedPtr<int> *)local_40,(SharedPtr<int> *)&t2.pointersAmount);
  SharedPtr<int>::reset((SharedPtr<int> *)&t2.pointersAmount,(int *)t1.pointersAmount);
  local_68 = SharedPtr<int>::get((SharedPtr<int> *)&t2.pointersAmount);
  testing::internal::EqHelper<false>::Compare<int*,int*>
            ((EqHelper<false> *)local_60,"t1.get()","b",&local_68,(int **)&t1.pointersAmount);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_90 = SharedPtr<int>::get((SharedPtr<int> *)local_40);
  testing::internal::EqHelper<false>::Compare<int*,int*>
            ((EqHelper<false> *)local_88,"t2.get()","a",&local_90,&b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_b8 = SharedPtr<int>::use_count((SharedPtr<int> *)&t2.pointersAmount);
  local_bc = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_b0,"t1.use_count()","1",&local_b8,&local_bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_e8 = SharedPtr<int>::use_count((SharedPtr<int> *)local_40);
  local_ec = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_e0,"t2.use_count()","1",&local_e8,&local_ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  SharedPtr<int>::~SharedPtr((SharedPtr<int> *)local_40);
  SharedPtr<int>::~SharedPtr((SharedPtr<int> *)&t2.pointersAmount);
  return;
}

Assistant:

TEST(SharedPtrTests_misc, Reset) {
	int* a;
	int* b;
	a = new int;
	b = new int;
	*a = 1234;
	*b = 5678;
	SharedPtr<int> t1(a);
	SharedPtr<int> t2(t1);
	t1.reset(b);
	EXPECT_EQ(t1.get(), b);
	EXPECT_EQ(t2.get(), a);
	EXPECT_EQ(t1.use_count(), 1);
	EXPECT_EQ(t2.use_count(), 1);
}